

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer.cc
# Opt level: O1

void __thiscall
Typelib::Importer::load(Importer *this,string *path,config_set *config,Registry *registry)

{
  ImportError *this_00;
  ifstream s;
  string local_258;
  long local_238 [4];
  byte abStack_218 [488];
  
  std::ifstream::ifstream(local_238,(path->_M_dataplus)._M_p,_S_in);
  if ((abStack_218[*(long *)(local_238[0] + -0x18)] & 5) == 0) {
    (*this->_vptr_Importer[2])(this,local_238,config,registry);
    std::ifstream::~ifstream(local_238);
    return;
  }
  this_00 = (ImportError *)__cxa_allocate_exception(0x60);
  local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,"cannot open for reading","")
  ;
  ImportError::ImportError(this_00,path,&local_258,0,0);
  __cxa_throw(this_00,&ImportError::typeinfo,ImportError::~ImportError);
}

Assistant:

void Importer::load
    ( std::string const& path
    , utilmm::config_set const& config
    , Registry& registry)
{
    // Check that the input file can be opened
    ifstream s(path.c_str());
    if (!s)
        throw ImportError(path, "cannot open for reading");
    load(s, config, registry);
}